

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  ostream *this;
  int *in_RSI;
  char **in_stack_ffffffffffffffe8;
  
  this = std::operator<<((ostream *)&std::cout,"\nExecuting test...");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  testing::InitGoogleTest(in_RSI,in_stack_ffffffffffffffe8);
  iVar1 = RUN_ALL_TESTS();
  return iVar1;
}

Assistant:

int main(int argc, char *argv[])
{
	std::cout << "\nExecuting test..." << std::endl;

	::testing::InitGoogleTest(&argc, argv);
	return RUN_ALL_TESTS();
}